

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Result::Result(Result *this,CURLcode *code)

{
  char *pcVar1;
  CURLcode *code_local;
  Result *this_local;
  
  this->curl_code = CURLE_OK;
  this->http_response_code = 0;
  std::__cxx11::string::string((string *)&this->msg);
  std::__cxx11::string::string((string *)&this->body);
  this->curl_code = *code;
  pcVar1 = (char *)curl_easy_strerror(*code);
  std::__cxx11::string::operator=((string *)&this->msg,pcVar1);
  return;
}

Assistant:

Result(const CURLcode& code) {
            curl_code = code;
            msg = curl_easy_strerror(code);
        }